

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void __thiscall argo::json::json(json *this,string *s)

{
  pointer pcVar1;
  
  (this->m_raw_value)._M_dataplus._M_p = (pointer)&(this->m_raw_value).field_2;
  (this->m_raw_value)._M_string_length = 0;
  (this->m_raw_value).field_2._M_local_buf[0] = '\0';
  this->m_type = string_e;
  (this->m_value).u_array.
  super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)((long)&this->m_value + 0x10);
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_value,pcVar1,pcVar1 + s->_M_string_length);
  return;
}

Assistant:

json::json(const string &s)
{
    become_string(s);
}